

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.h
# Opt level: O3

void __thiscall libwebm::Webm2Pes::~Webm2Pes(Webm2Pes *this)

{
  pointer puVar1;
  FILE *__stream;
  pointer pcVar2;
  
  puVar1 = (this->packet_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  __stream = (FILE *)(this->output_file_)._M_t.super___uniq_ptr_impl<_IO_FILE,_libwebm::FILEDeleter>
                     ._M_t.super__Tuple_impl<0UL,__IO_FILE_*,_libwebm::FILEDeleter>.
                     super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  (this->output_file_)._M_t.super___uniq_ptr_impl<_IO_FILE,_libwebm::FILEDeleter>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_libwebm::FILEDeleter>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (_IO_FILE *)0x0;
  mkvparser::MkvReader::~MkvReader(&this->webm_reader_);
  std::unique_ptr<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_>::~unique_ptr
            (&this->webm_parser_);
  pcVar2 = (this->output_file_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->output_file_name_).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->input_file_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->input_file_name_).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

~Webm2Pes() = default;